

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.h
# Opt level: O2

JObject * __thiscall
pstack::JObject::field<char[18],int,char>(JObject *this,char (*k) [18],int *v,char *c)

{
  ostream *os;
  char (*local_40) [18];
  Field<char[18],_int> field;
  
  local_40 = k;
  field.k = (char (*) [18])v;
  os = std::operator<<(this->os,this->sep);
  field.v = (int *)&local_40;
  pstack::operator<<(os,(JSON<pstack::Field<char[18],_int>,_char> *)&field.v);
  this->sep = ", ";
  return this;
}

Assistant:

JObject &field(const K &k, const V&v, const C &c = C()) {
         Field<K,V> field(k, v);
         os << sep << json(field, c);
         sep = ", ";
         return *this;
      }